

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O3

void luaD_poscall(lua_State *L,CallInfo *ci,int nres)

{
  unsigned_short *puVar1;
  short sVar2;
  CallInfo *pCVar3;
  StkId pSVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  lu_byte lVar33;
  uint uVar34;
  StkId level;
  undefined1 *puVar35;
  long lVar36;
  ulong uVar37;
  long lVar38;
  uint uVar39;
  TValue *io1;
  undefined1 auVar40 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  int iVar60;
  int iVar63;
  int iVar64;
  undefined1 auVar61 [16];
  int iVar65;
  undefined1 auVar62 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  int iVar79;
  int iVar83;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  
  sVar2 = ci->nresults;
  if (-2 < sVar2 && L->hookmask != 0) {
    rethook(L,ci,nres);
  }
  level = (ci->func).p;
  uVar39 = nres;
  if (sVar2 != -1) {
    if (sVar2 == 1) {
      if (nres == 0) {
        lVar33 = '\0';
      }
      else {
        pSVar4 = (L->top).p;
        (level->val).value_ = pSVar4[-(long)nres].val.value_;
        lVar33 = *(lu_byte *)((long)pSVar4 + (long)nres * -0x10 + 8);
      }
      (level->val).tt_ = lVar33;
      level = level + 1;
      goto LAB_0010ac37;
    }
    if (sVar2 == 0) goto LAB_0010ac37;
    uVar39 = (int)sVar2;
    if (sVar2 < -1) {
      pCVar3 = L->ci;
      puVar1 = &pCVar3->callstatus;
      *puVar1 = *puVar1 | 0x200;
      (pCVar3->u2).funcidx = nres;
      level = luaF_close(L,level,-1,1);
      pCVar3 = L->ci;
      puVar1 = &pCVar3->callstatus;
      *puVar1 = *puVar1 & 0xfdff;
      if (L->hookmask != 0) {
        lVar38 = (L->stack).offset;
        rethook(L,pCVar3,nres);
        level = (StkId)(((long)level - lVar38) + (long)(L->stack).p);
      }
      uVar39 = -(int)sVar2 - 3;
      if (sVar2 == -2) {
        uVar39 = nres;
      }
    }
  }
  uVar34 = nres;
  if ((int)uVar39 < nres) {
    uVar34 = uVar39;
  }
  if ((int)uVar34 < 1) {
    uVar34 = 0;
  }
  else {
    pSVar4 = (L->top).p;
    lVar38 = 0;
    do {
      *(undefined8 *)((long)level + lVar38) =
           *(undefined8 *)((long)pSVar4 + lVar38 + (long)nres * -0x10);
      *(undefined1 *)((long)level + lVar38 + 8) =
           *(undefined1 *)((long)pSVar4 + lVar38 + (long)nres * -0x10 + 8);
      lVar38 = lVar38 + 0x10;
    } while ((ulong)uVar34 << 4 != lVar38);
  }
  auVar32 = _DAT_0012b780;
  auVar31 = _DAT_0012b770;
  auVar30 = _DAT_0012b760;
  auVar29 = _DAT_0012b750;
  auVar28 = _DAT_0012b740;
  auVar27 = _DAT_0012b730;
  auVar26 = _DAT_0012b720;
  if ((int)uVar34 < (int)uVar39) {
    lVar38 = (ulong)uVar39 - (ulong)uVar34;
    lVar36 = lVar38 + -1;
    auVar40._8_4_ = (int)lVar36;
    auVar40._0_8_ = lVar36;
    auVar40._12_4_ = (int)((ulong)lVar36 >> 0x20);
    puVar35 = (undefined1 *)((long)level + (ulong)uVar34 * 0x10 + 0xf8);
    uVar37 = 0;
    do {
      auVar58._8_4_ = (int)uVar37;
      auVar58._0_8_ = uVar37;
      auVar58._12_4_ = (int)(uVar37 >> 0x20);
      auVar61 = auVar40 ^ auVar32;
      auVar66 = (auVar58 | auVar31) ^ auVar32;
      iVar60 = auVar61._0_4_;
      iVar79 = -(uint)(iVar60 < auVar66._0_4_);
      iVar63 = auVar61._4_4_;
      auVar68._4_4_ = -(uint)(iVar63 < auVar66._4_4_);
      iVar64 = auVar61._8_4_;
      iVar83 = -(uint)(iVar64 < auVar66._8_4_);
      iVar65 = auVar61._12_4_;
      auVar68._12_4_ = -(uint)(iVar65 < auVar66._12_4_);
      auVar41._4_4_ = iVar79;
      auVar41._0_4_ = iVar79;
      auVar41._8_4_ = iVar83;
      auVar41._12_4_ = iVar83;
      auVar41 = pshuflw(in_XMM1,auVar41,0xe8);
      auVar67._4_4_ = -(uint)(auVar66._4_4_ == iVar63);
      auVar67._12_4_ = -(uint)(auVar66._12_4_ == iVar65);
      auVar67._0_4_ = auVar67._4_4_;
      auVar67._8_4_ = auVar67._12_4_;
      auVar50 = pshuflw(in_XMM2,auVar67,0xe8);
      auVar68._0_4_ = auVar68._4_4_;
      auVar68._8_4_ = auVar68._12_4_;
      auVar66 = pshuflw(auVar41,auVar68,0xe8);
      auVar61._8_4_ = 0xffffffff;
      auVar61._0_8_ = 0xffffffffffffffff;
      auVar61._12_4_ = 0xffffffff;
      auVar61 = (auVar66 | auVar50 & auVar41) ^ auVar61;
      auVar61 = packssdw(auVar61,auVar61);
      if ((auVar61 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        puVar35[-0xf0] = 0;
      }
      auVar50._4_4_ = iVar79;
      auVar50._0_4_ = iVar79;
      auVar50._8_4_ = iVar83;
      auVar50._12_4_ = iVar83;
      auVar68 = auVar67 & auVar50 | auVar68;
      auVar61 = packssdw(auVar68,auVar68);
      auVar66._8_4_ = 0xffffffff;
      auVar66._0_8_ = 0xffffffffffffffff;
      auVar66._12_4_ = 0xffffffff;
      auVar61 = packssdw(auVar61 ^ auVar66,auVar61 ^ auVar66);
      auVar61 = packsswb(auVar61,auVar61);
      if ((auVar61._0_4_ >> 8 & 1) != 0) {
        puVar35[-0xe0] = 0;
      }
      auVar61 = (auVar58 | auVar30) ^ auVar32;
      auVar51._0_4_ = -(uint)(iVar60 < auVar61._0_4_);
      auVar51._4_4_ = -(uint)(iVar63 < auVar61._4_4_);
      auVar51._8_4_ = -(uint)(iVar64 < auVar61._8_4_);
      auVar51._12_4_ = -(uint)(iVar65 < auVar61._12_4_);
      auVar69._4_4_ = auVar51._0_4_;
      auVar69._0_4_ = auVar51._0_4_;
      auVar69._8_4_ = auVar51._8_4_;
      auVar69._12_4_ = auVar51._8_4_;
      iVar79 = -(uint)(auVar61._4_4_ == iVar63);
      iVar83 = -(uint)(auVar61._12_4_ == iVar65);
      auVar14._4_4_ = iVar79;
      auVar14._0_4_ = iVar79;
      auVar14._8_4_ = iVar83;
      auVar14._12_4_ = iVar83;
      auVar80._4_4_ = auVar51._4_4_;
      auVar80._0_4_ = auVar51._4_4_;
      auVar80._8_4_ = auVar51._12_4_;
      auVar80._12_4_ = auVar51._12_4_;
      auVar61 = auVar14 & auVar69 | auVar80;
      auVar61 = packssdw(auVar61,auVar61);
      auVar5._8_4_ = 0xffffffff;
      auVar5._0_8_ = 0xffffffffffffffff;
      auVar5._12_4_ = 0xffffffff;
      auVar61 = packssdw(auVar61 ^ auVar5,auVar61 ^ auVar5);
      auVar61 = packsswb(auVar61,auVar61);
      if ((auVar61._0_4_ >> 0x10 & 1) != 0) {
        puVar35[-0xd0] = 0;
      }
      auVar61 = pshufhw(auVar61,auVar69,0x84);
      auVar15._4_4_ = iVar79;
      auVar15._0_4_ = iVar79;
      auVar15._8_4_ = iVar83;
      auVar15._12_4_ = iVar83;
      auVar66 = pshufhw(auVar51,auVar15,0x84);
      auVar41 = pshufhw(auVar61,auVar80,0x84);
      auVar42._8_4_ = 0xffffffff;
      auVar42._0_8_ = 0xffffffffffffffff;
      auVar42._12_4_ = 0xffffffff;
      auVar42 = (auVar41 | auVar66 & auVar61) ^ auVar42;
      auVar61 = packssdw(auVar42,auVar42);
      auVar61 = packsswb(auVar61,auVar61);
      if ((auVar61._0_4_ >> 0x18 & 1) != 0) {
        puVar35[-0xc0] = 0;
      }
      auVar61 = (auVar58 | auVar29) ^ auVar32;
      auVar52._0_4_ = -(uint)(iVar60 < auVar61._0_4_);
      auVar52._4_4_ = -(uint)(iVar63 < auVar61._4_4_);
      auVar52._8_4_ = -(uint)(iVar64 < auVar61._8_4_);
      auVar52._12_4_ = -(uint)(iVar65 < auVar61._12_4_);
      auVar16._4_4_ = auVar52._0_4_;
      auVar16._0_4_ = auVar52._0_4_;
      auVar16._8_4_ = auVar52._8_4_;
      auVar16._12_4_ = auVar52._8_4_;
      auVar66 = pshuflw(auVar80,auVar16,0xe8);
      auVar43._0_4_ = -(uint)(auVar61._0_4_ == iVar60);
      auVar43._4_4_ = -(uint)(auVar61._4_4_ == iVar63);
      auVar43._8_4_ = -(uint)(auVar61._8_4_ == iVar64);
      auVar43._12_4_ = -(uint)(auVar61._12_4_ == iVar65);
      auVar70._4_4_ = auVar43._4_4_;
      auVar70._0_4_ = auVar43._4_4_;
      auVar70._8_4_ = auVar43._12_4_;
      auVar70._12_4_ = auVar43._12_4_;
      auVar61 = pshuflw(auVar43,auVar70,0xe8);
      auVar71._4_4_ = auVar52._4_4_;
      auVar71._0_4_ = auVar52._4_4_;
      auVar71._8_4_ = auVar52._12_4_;
      auVar71._12_4_ = auVar52._12_4_;
      auVar41 = pshuflw(auVar52,auVar71,0xe8);
      auVar6._8_4_ = 0xffffffff;
      auVar6._0_8_ = 0xffffffffffffffff;
      auVar6._12_4_ = 0xffffffff;
      auVar61 = packssdw(auVar61 & auVar66,(auVar41 | auVar61 & auVar66) ^ auVar6);
      auVar61 = packsswb(auVar61,auVar61);
      if ((auVar61 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        puVar35[-0xb0] = 0;
      }
      auVar17._4_4_ = auVar52._0_4_;
      auVar17._0_4_ = auVar52._0_4_;
      auVar17._8_4_ = auVar52._8_4_;
      auVar17._12_4_ = auVar52._8_4_;
      auVar71 = auVar70 & auVar17 | auVar71;
      auVar41 = packssdw(auVar71,auVar71);
      auVar7._8_4_ = 0xffffffff;
      auVar7._0_8_ = 0xffffffffffffffff;
      auVar7._12_4_ = 0xffffffff;
      auVar61 = packssdw(auVar61,auVar41 ^ auVar7);
      auVar61 = packsswb(auVar61,auVar61);
      if ((auVar61._4_2_ >> 8 & 1) != 0) {
        puVar35[-0xa0] = 0;
      }
      auVar61 = (auVar58 | auVar28) ^ auVar32;
      auVar53._0_4_ = -(uint)(iVar60 < auVar61._0_4_);
      auVar53._4_4_ = -(uint)(iVar63 < auVar61._4_4_);
      auVar53._8_4_ = -(uint)(iVar64 < auVar61._8_4_);
      auVar53._12_4_ = -(uint)(iVar65 < auVar61._12_4_);
      auVar72._4_4_ = auVar53._0_4_;
      auVar72._0_4_ = auVar53._0_4_;
      auVar72._8_4_ = auVar53._8_4_;
      auVar72._12_4_ = auVar53._8_4_;
      iVar79 = -(uint)(auVar61._4_4_ == iVar63);
      iVar83 = -(uint)(auVar61._12_4_ == iVar65);
      auVar18._4_4_ = iVar79;
      auVar18._0_4_ = iVar79;
      auVar18._8_4_ = iVar83;
      auVar18._12_4_ = iVar83;
      auVar81._4_4_ = auVar53._4_4_;
      auVar81._0_4_ = auVar53._4_4_;
      auVar81._8_4_ = auVar53._12_4_;
      auVar81._12_4_ = auVar53._12_4_;
      auVar61 = auVar18 & auVar72 | auVar81;
      auVar61 = packssdw(auVar61,auVar61);
      auVar8._8_4_ = 0xffffffff;
      auVar8._0_8_ = 0xffffffffffffffff;
      auVar8._12_4_ = 0xffffffff;
      auVar61 = packssdw(auVar61 ^ auVar8,auVar61 ^ auVar8);
      auVar61 = packsswb(auVar61,auVar61);
      if ((auVar61 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        puVar35[-0x90] = 0;
      }
      auVar61 = pshufhw(auVar61,auVar72,0x84);
      auVar19._4_4_ = iVar79;
      auVar19._0_4_ = iVar79;
      auVar19._8_4_ = iVar83;
      auVar19._12_4_ = iVar83;
      auVar66 = pshufhw(auVar53,auVar19,0x84);
      auVar41 = pshufhw(auVar61,auVar81,0x84);
      auVar44._8_4_ = 0xffffffff;
      auVar44._0_8_ = 0xffffffffffffffff;
      auVar44._12_4_ = 0xffffffff;
      auVar44 = (auVar41 | auVar66 & auVar61) ^ auVar44;
      auVar61 = packssdw(auVar44,auVar44);
      auVar61 = packsswb(auVar61,auVar61);
      if ((auVar61._6_2_ >> 8 & 1) != 0) {
        puVar35[-0x80] = 0;
      }
      auVar61 = (auVar58 | auVar27) ^ auVar32;
      auVar54._0_4_ = -(uint)(iVar60 < auVar61._0_4_);
      auVar54._4_4_ = -(uint)(iVar63 < auVar61._4_4_);
      auVar54._8_4_ = -(uint)(iVar64 < auVar61._8_4_);
      auVar54._12_4_ = -(uint)(iVar65 < auVar61._12_4_);
      auVar20._4_4_ = auVar54._0_4_;
      auVar20._0_4_ = auVar54._0_4_;
      auVar20._8_4_ = auVar54._8_4_;
      auVar20._12_4_ = auVar54._8_4_;
      auVar66 = pshuflw(auVar81,auVar20,0xe8);
      auVar45._0_4_ = -(uint)(auVar61._0_4_ == iVar60);
      auVar45._4_4_ = -(uint)(auVar61._4_4_ == iVar63);
      auVar45._8_4_ = -(uint)(auVar61._8_4_ == iVar64);
      auVar45._12_4_ = -(uint)(auVar61._12_4_ == iVar65);
      auVar73._4_4_ = auVar45._4_4_;
      auVar73._0_4_ = auVar45._4_4_;
      auVar73._8_4_ = auVar45._12_4_;
      auVar73._12_4_ = auVar45._12_4_;
      auVar61 = pshuflw(auVar45,auVar73,0xe8);
      auVar74._4_4_ = auVar54._4_4_;
      auVar74._0_4_ = auVar54._4_4_;
      auVar74._8_4_ = auVar54._12_4_;
      auVar74._12_4_ = auVar54._12_4_;
      auVar41 = pshuflw(auVar54,auVar74,0xe8);
      auVar55._8_4_ = 0xffffffff;
      auVar55._0_8_ = 0xffffffffffffffff;
      auVar55._12_4_ = 0xffffffff;
      auVar55 = (auVar41 | auVar61 & auVar66) ^ auVar55;
      auVar41 = packssdw(auVar55,auVar55);
      auVar61 = packsswb(auVar61 & auVar66,auVar41);
      if ((auVar61 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        puVar35[-0x70] = 0;
      }
      auVar21._4_4_ = auVar54._0_4_;
      auVar21._0_4_ = auVar54._0_4_;
      auVar21._8_4_ = auVar54._8_4_;
      auVar21._12_4_ = auVar54._8_4_;
      auVar74 = auVar73 & auVar21 | auVar74;
      auVar41 = packssdw(auVar74,auVar74);
      auVar9._8_4_ = 0xffffffff;
      auVar9._0_8_ = 0xffffffffffffffff;
      auVar9._12_4_ = 0xffffffff;
      auVar41 = packssdw(auVar41 ^ auVar9,auVar41 ^ auVar9);
      auVar61 = packsswb(auVar61,auVar41);
      if ((auVar61._8_2_ >> 8 & 1) != 0) {
        puVar35[-0x60] = 0;
      }
      auVar61 = (auVar58 | auVar26) ^ auVar32;
      auVar56._0_4_ = -(uint)(iVar60 < auVar61._0_4_);
      auVar56._4_4_ = -(uint)(iVar63 < auVar61._4_4_);
      auVar56._8_4_ = -(uint)(iVar64 < auVar61._8_4_);
      auVar56._12_4_ = -(uint)(iVar65 < auVar61._12_4_);
      auVar75._4_4_ = auVar56._0_4_;
      auVar75._0_4_ = auVar56._0_4_;
      auVar75._8_4_ = auVar56._8_4_;
      auVar75._12_4_ = auVar56._8_4_;
      iVar79 = -(uint)(auVar61._4_4_ == iVar63);
      iVar83 = -(uint)(auVar61._12_4_ == iVar65);
      auVar22._4_4_ = iVar79;
      auVar22._0_4_ = iVar79;
      auVar22._8_4_ = iVar83;
      auVar22._12_4_ = iVar83;
      auVar82._4_4_ = auVar56._4_4_;
      auVar82._0_4_ = auVar56._4_4_;
      auVar82._8_4_ = auVar56._12_4_;
      auVar82._12_4_ = auVar56._12_4_;
      auVar61 = auVar22 & auVar75 | auVar82;
      auVar61 = packssdw(auVar61,auVar61);
      auVar10._8_4_ = 0xffffffff;
      auVar10._0_8_ = 0xffffffffffffffff;
      auVar10._12_4_ = 0xffffffff;
      auVar61 = packssdw(auVar61 ^ auVar10,auVar61 ^ auVar10);
      auVar61 = packsswb(auVar61,auVar61);
      if ((auVar61 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        puVar35[-0x50] = 0;
      }
      auVar61 = pshufhw(auVar61,auVar75,0x84);
      auVar23._4_4_ = iVar79;
      auVar23._0_4_ = iVar79;
      auVar23._8_4_ = iVar83;
      auVar23._12_4_ = iVar83;
      auVar66 = pshufhw(auVar56,auVar23,0x84);
      auVar41 = pshufhw(auVar61,auVar82,0x84);
      auVar46._8_4_ = 0xffffffff;
      auVar46._0_8_ = 0xffffffffffffffff;
      auVar46._12_4_ = 0xffffffff;
      auVar46 = (auVar41 | auVar66 & auVar61) ^ auVar46;
      auVar61 = packssdw(auVar46,auVar46);
      auVar61 = packsswb(auVar61,auVar61);
      if ((auVar61._10_2_ >> 8 & 1) != 0) {
        puVar35[-0x40] = 0;
      }
      auVar61 = (auVar58 | _DAT_0012b710) ^ auVar32;
      auVar57._0_4_ = -(uint)(iVar60 < auVar61._0_4_);
      auVar57._4_4_ = -(uint)(iVar63 < auVar61._4_4_);
      auVar57._8_4_ = -(uint)(iVar64 < auVar61._8_4_);
      auVar57._12_4_ = -(uint)(iVar65 < auVar61._12_4_);
      auVar24._4_4_ = auVar57._0_4_;
      auVar24._0_4_ = auVar57._0_4_;
      auVar24._8_4_ = auVar57._8_4_;
      auVar24._12_4_ = auVar57._8_4_;
      auVar66 = pshuflw(auVar82,auVar24,0xe8);
      auVar47._0_4_ = -(uint)(auVar61._0_4_ == iVar60);
      auVar47._4_4_ = -(uint)(auVar61._4_4_ == iVar63);
      auVar47._8_4_ = -(uint)(auVar61._8_4_ == iVar64);
      auVar47._12_4_ = -(uint)(auVar61._12_4_ == iVar65);
      auVar76._4_4_ = auVar47._4_4_;
      auVar76._0_4_ = auVar47._4_4_;
      auVar76._8_4_ = auVar47._12_4_;
      auVar76._12_4_ = auVar47._12_4_;
      auVar61 = pshuflw(auVar47,auVar76,0xe8);
      auVar77._4_4_ = auVar57._4_4_;
      auVar77._0_4_ = auVar57._4_4_;
      auVar77._8_4_ = auVar57._12_4_;
      auVar77._12_4_ = auVar57._12_4_;
      auVar41 = pshuflw(auVar57,auVar77,0xe8);
      auVar11._8_4_ = 0xffffffff;
      auVar11._0_8_ = 0xffffffffffffffff;
      auVar11._12_4_ = 0xffffffff;
      auVar61 = packssdw(auVar61 & auVar66,(auVar41 | auVar61 & auVar66) ^ auVar11);
      auVar61 = packsswb(auVar61,auVar61);
      if ((auVar61 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        puVar35[-0x30] = 0;
      }
      auVar25._4_4_ = auVar57._0_4_;
      auVar25._0_4_ = auVar57._0_4_;
      auVar25._8_4_ = auVar57._8_4_;
      auVar25._12_4_ = auVar57._8_4_;
      auVar77 = auVar76 & auVar25 | auVar77;
      auVar41 = packssdw(auVar77,auVar77);
      auVar12._8_4_ = 0xffffffff;
      auVar12._0_8_ = 0xffffffffffffffff;
      auVar12._12_4_ = 0xffffffff;
      auVar61 = packssdw(auVar61,auVar41 ^ auVar12);
      auVar61 = packsswb(auVar61,auVar61);
      if ((auVar61._12_2_ >> 8 & 1) != 0) {
        puVar35[-0x20] = 0;
      }
      auVar61 = (auVar58 | _DAT_0012b700) ^ auVar32;
      auVar48._0_4_ = -(uint)(iVar60 < auVar61._0_4_);
      auVar48._4_4_ = -(uint)(iVar63 < auVar61._4_4_);
      auVar48._8_4_ = -(uint)(iVar64 < auVar61._8_4_);
      auVar48._12_4_ = -(uint)(iVar65 < auVar61._12_4_);
      auVar78._4_4_ = auVar48._0_4_;
      auVar78._0_4_ = auVar48._0_4_;
      auVar78._8_4_ = auVar48._8_4_;
      auVar78._12_4_ = auVar48._8_4_;
      auVar59._4_4_ = -(uint)(auVar61._4_4_ == iVar63);
      auVar59._12_4_ = -(uint)(auVar61._12_4_ == iVar65);
      auVar59._0_4_ = auVar59._4_4_;
      auVar59._8_4_ = auVar59._12_4_;
      auVar62._4_4_ = auVar48._4_4_;
      auVar62._0_4_ = auVar48._4_4_;
      auVar62._8_4_ = auVar48._12_4_;
      auVar62._12_4_ = auVar48._12_4_;
      auVar41 = auVar59 & auVar78 | auVar62;
      auVar61 = packssdw(auVar48,auVar41);
      auVar13._8_4_ = 0xffffffff;
      auVar13._0_8_ = 0xffffffffffffffff;
      auVar13._12_4_ = 0xffffffff;
      auVar61 = packssdw(auVar61 ^ auVar13,auVar61 ^ auVar13);
      auVar61 = packsswb(auVar61,auVar61);
      if ((auVar61 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        puVar35[-0x10] = 0;
      }
      auVar61 = pshufhw(auVar61,auVar78,0x84);
      auVar41 = pshufhw(auVar41,auVar59,0x84);
      in_XMM2 = auVar41 & auVar61;
      auVar61 = pshufhw(auVar61,auVar62,0x84);
      auVar49._8_4_ = 0xffffffff;
      auVar49._0_8_ = 0xffffffffffffffff;
      auVar49._12_4_ = 0xffffffff;
      auVar49 = (auVar61 | in_XMM2) ^ auVar49;
      auVar61 = packssdw(auVar49,auVar49);
      in_XMM1 = packsswb(auVar61,auVar61);
      if ((in_XMM1._14_2_ >> 8 & 1) != 0) {
        *puVar35 = 0;
      }
      uVar37 = uVar37 + 0x10;
      puVar35 = puVar35 + 0x100;
    } while ((lVar38 + 0xfU & 0xfffffffffffffff0) != uVar37);
  }
  level = level + (int)uVar39;
LAB_0010ac37:
  (L->top).p = level;
  L->ci = ci->previous;
  return;
}

Assistant:

void luaD_poscall (lua_State *L, CallInfo *ci, int nres) {
  int wanted = ci->nresults;
  if (l_unlikely(L->hookmask && !hastocloseCfunc(wanted)))
    rethook(L, ci, nres);
  /* move results to proper place */
  moveresults(L, ci->func.p, nres, wanted);
  /* function cannot be in any of these cases when returning */
  lua_assert(!(ci->callstatus &
        (CIST_HOOKED | CIST_YPCALL | CIST_FIN | CIST_TRAN | CIST_CLSRET)));
  L->ci = ci->previous;  /* back to caller (after closing variables) */
}